

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_segs.cpp
# Opt level: O3

void wallscan(int x1,int x2,short *uwal,short *dwal,float *swal,fixed_t *lwal,double yrepeat,
             _func_BYTE_ptr_FTexture_ptr_int *getcol)

{
  long lVar1;
  short sVar2;
  short sVar3;
  fixed_t fVar4;
  fixed_t *pfVar5;
  int iVar6;
  DWORD DVar7;
  BYTE *pBVar8;
  byte bVar9;
  long lVar10;
  byte bVar11;
  int iVar12;
  long unaff_RBP;
  short *psVar13;
  undefined4 in_register_00000034;
  long lVar14;
  int iVar15;
  short *psVar16;
  int unaff_R14D;
  float *pfVar17;
  bool bVar18;
  bool bVar19;
  float fVar20;
  float fVar21;
  double dVar22;
  double dVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  uint uVar27;
  uint uVar31;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  uint uVar32;
  uint uVar33;
  fixed_t *local_f0;
  long local_e0;
  undefined1 local_c8 [16];
  int local_a8 [4];
  int local_98 [4];
  undefined8 local_88;
  float *local_80;
  fixed_t *local_78;
  long local_70;
  BYTE *local_68;
  short *local_60;
  short *local_58;
  double local_50;
  _func_BYTE_ptr_FTexture_ptr_int *local_48;
  double local_40;
  int local_34;
  
  local_88 = CONCAT44(in_register_00000034,x2);
  if (rw_pic->UseType == '\r') {
    return;
  }
  local_c8 = ZEXT416((uint)(rw_light - rw_lightstep));
  local_48 = getcol;
  iVar12 = 0x20 - (uint)rw_pic->HeightBits;
  local_80 = swal;
  local_78 = lwal;
  local_60 = uwal;
  local_58 = dwal;
  local_40 = yrepeat;
  setupvline(iVar12);
  psVar16 = local_58;
  psVar13 = local_60;
  pfVar5 = local_78;
  fVar4 = rw_offset;
  bVar18 = fixedcolormap != (lighttable_t *)0x0;
  bVar19 = -1 < fixedlightlev;
  local_68 = basecolormap->Maps;
  if (bVar19 || bVar18) {
    palookupoffse[2]._0_4_ = dc_colormap._0_4_;
    palookupoffse[2]._4_4_ = dc_colormap._4_4_;
    palookupoffse[3]._0_4_ = dc_colormap._0_4_;
    palookupoffse[3]._4_4_ = dc_colormap._4_4_;
    palookupoffse[0]._0_4_ = dc_colormap._0_4_;
    palookupoffse[0]._4_4_ = dc_colormap._4_4_;
    palookupoffse[1]._0_4_ = dc_colormap._0_4_;
    palookupoffse[1]._4_4_ = dc_colormap._4_4_;
  }
  iVar15 = (int)local_88;
  bVar9 = (byte)iVar12;
  if ((x1 & 3U) != 0 && x1 < iVar15) {
    local_50 = 6755399441055744.0 / (double)(1 << (bVar9 & 0x1f));
    lVar10 = (long)x1;
    pfVar17 = local_80 + lVar10;
    local_70 = CONCAT44(local_70._4_4_,x1);
    lVar14 = 0;
    fVar20 = rw_lightstep;
    do {
      local_c8._0_4_ = (float)local_c8._0_4_ + fVar20;
      sVar2 = psVar13[lVar10 + lVar14];
      unaff_RBP = (long)sVar2;
      unaff_R14D = (int)psVar16[lVar10 + lVar14];
      if (sVar2 < psVar16[lVar10 + lVar14]) {
        iVar12 = (int)sVar2;
        if (viewheight <= iVar12) {
          __assert_fail("y1ve[0] < viewheight",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_segs.cpp"
                        ,0x468,
                        "void wallscan(int, int, short *, short *, float *, fixed_t *, double, const BYTE *(*)(FTexture *, int))"
                       );
        }
        if (viewheight < unaff_R14D) {
          __assert_fail("y2ve[0] <= viewheight",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_segs.cpp"
                        ,0x469,
                        "void wallscan(int, int, short *, short *, float *, fixed_t *, double, const BYTE *(*)(FTexture *, int))"
                       );
        }
        if (!bVar19 && !bVar18) {
          dVar22 = (double)(float)local_c8._0_4_;
          if (24.0 <= dVar22) {
            dVar22 = 24.0;
          }
          iVar6 = wallshade - SUB84(dVar22 + 103079215104.0,0) >> 0x10;
          if (0x1e < iVar6) {
            iVar6 = 0x1f;
          }
          if (iVar6 < 1) {
            iVar6 = 0;
          }
          dc_colormap = local_68 + (uint)(iVar6 << 8);
        }
        dc_source = (*local_48)(rw_pic,pfVar5[lVar10 + lVar14] + fVar4 >> 0x10);
        dc_dest = dc_destorg + lVar10 + lVar14 + (long)ylookup[unaff_RBP];
        dc_count = unaff_R14D - iVar12;
        dc_iscale = SUB84((double)pfVar17[lVar14] * local_40 + local_50,0);
        dc_texturefrac =
             SUB84(dc_texturemid + local_50 +
                   (((double)iVar12 + 0.5) - CenterY) * (double)pfVar17[lVar14] * local_40,0);
        (*dovline1)();
        fVar20 = rw_lightstep;
      }
      lVar1 = lVar14 + 1;
    } while ((lVar14 + lVar10 + 1 < (long)iVar15) &&
            (iVar12 = (int)lVar14, lVar14 = lVar1, (x1 + iVar12 + 1U & 3) != 0));
    x1 = (int)local_70 + (int)lVar1;
  }
  local_98[0] = (int)unaff_RBP;
  local_a8[0] = unaff_R14D;
  iVar12 = (int)local_88;
  if (x1 < iVar12 + -3) {
    local_50 = 6755399441055744.0 / (double)(1 << (bVar9 & 0x1f));
    local_e0 = (long)x1;
    local_70 = (long)(iVar12 + -3);
    psVar13 = local_60 + local_e0;
    psVar16 = local_58 + local_e0;
    local_f0 = local_78 + local_e0;
    pfVar17 = local_80 + local_e0;
    do {
      lVar14 = 4;
      bVar11 = 0;
      do {
        sVar2 = psVar13[lVar14 + -1];
        iVar12 = (int)sVar2;
        local_a8[lVar14 + 3] = iVar12;
        sVar3 = psVar16[lVar14 + -1];
        local_a8[lVar14 + -1] = (int)sVar3;
        if (sVar2 < sVar3) {
          if (viewheight <= iVar12) {
            __assert_fail("y1ve[z] < viewheight",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_segs.cpp"
                          ,0x482,
                          "void wallscan(int, int, short *, short *, float *, fixed_t *, double, const BYTE *(*)(FTexture *, int))"
                         );
          }
          if (viewheight < sVar3) {
            __assert_fail("y2ve[z] <= viewheight",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_segs.cpp"
                          ,0x483,
                          "void wallscan(int, int, short *, short *, float *, fixed_t *, double, const BYTE *(*)(FTexture *, int))"
                         );
          }
          pBVar8 = (*local_48)(rw_pic,local_f0[lVar14 + -1] + fVar4 >> 0x10);
          palookupoffse[lVar14 + 3] = pBVar8;
          fVar20 = pfVar17[lVar14 + -1];
          dVar22 = ((double)iVar12 + 0.5) - CenterY;
          vplce[lVar14 + 3] = SUB84((double)fVar20 * local_40 + local_50,0);
          *(int *)(lVar14 * 4 + 0x8b408c) =
               SUB84(dc_texturemid + local_50 + dVar22 * (double)fVar20 * local_40,0);
        }
        else {
          bVar11 = bVar11 + (char)(1 << ((char)lVar14 - 1U & 0x1f));
        }
        fVar20 = rw_lightstep;
        iVar12 = wallshade;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
      if (bVar11 == 0xf) {
        local_c8._0_4_ = (float)local_c8._0_4_ + rw_lightstep * 4.0;
      }
      else {
        if (!bVar19 && !bVar18) {
          fVar21 = rw_lightstep * 4.0 + (float)local_c8._0_4_;
          fVar25 = rw_lightstep * 0.0 + (float)local_c8._0_4_;
          fVar26 = rw_lightstep * 1.0 + (float)local_c8._0_4_;
          fVar24 = rw_lightstep + rw_lightstep;
          lVar14 = 0;
          do {
            auVar28._0_8_ = (double)(fVar20 + fVar25);
            auVar28._8_8_ = (double)(fVar20 + fVar26);
            auVar29._8_8_ = 0x4038000000000000;
            auVar29._0_8_ = 0x4038000000000000;
            auVar29 = minpd(auVar28,auVar29);
            uVar32 = iVar12 - SUB84(auVar29._0_8_ + 103079215104.0,0) >> 0x10;
            uVar33 = iVar12 - SUB84(auVar29._8_8_ + 103079215104.0,0) >> 0x10;
            uVar27 = -(uint)((int)uVar32 < 0x1f);
            uVar31 = -(uint)((int)uVar33 < 0x1f);
            uVar27 = ~uVar27 & 0x1f | uVar32 & uVar27;
            uVar31 = ~uVar31 & 0x1f | uVar33 & uVar31;
            auVar30._8_4_ = (int)local_68;
            auVar30._0_8_ = local_68;
            auVar30._12_4_ = (int)((ulong)local_68 >> 0x20);
            palookupoffse[lVar14] = local_68 + ((-(uint)(0 < (int)uVar27) & uVar27) << 8);
            palookupoffse[lVar14 + 1] =
                 (BYTE *)(auVar30._8_8_ + (ulong)((-(uint)(0 < (int)uVar31) & uVar31) << 8));
            lVar14 = lVar14 + 2;
            fVar25 = fVar25 + fVar24;
            fVar26 = fVar26 + fVar24;
            local_c8 = ZEXT416((uint)fVar21);
          } while (lVar14 != 4);
        }
        iVar12 = local_98[1];
        if (local_98[1] < local_98[0]) {
          iVar12 = local_98[0];
        }
        iVar15 = local_98[3];
        if (local_98[3] < local_98[2]) {
          iVar15 = local_98[2];
        }
        if (iVar15 < iVar12) {
          iVar15 = iVar12;
        }
        iVar12 = local_a8[1];
        if (local_a8[0] < local_a8[1]) {
          iVar12 = local_a8[0];
        }
        iVar6 = local_a8[3];
        if (local_a8[2] < local_a8[3]) {
          iVar6 = local_a8[2];
        }
        if (iVar12 < iVar6) {
          iVar6 = iVar12;
        }
        if ((bVar11 == 0) && (iVar6 - iVar15 != 0 && iVar15 <= iVar6)) {
          lVar14 = 0;
          local_34 = iVar6 - iVar15;
          do {
            iVar12 = local_a8[lVar14 + 4];
            if (iVar12 < iVar15) {
              dc_count = iVar15 - iVar12;
              dc_iscale = vince[lVar14];
              dc_colormap = palookupoffse[lVar14];
              dc_texturefrac = vplce[lVar14];
              dc_source = bufplce[lVar14];
              dc_dest = dc_destorg + (x1 + (int)lVar14 + ylookup[iVar12]);
              DVar7 = (*doprevline1)();
              vplce[lVar14] = DVar7;
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 != 4);
          dc_count = local_34;
          dc_dest = dc_destorg + ylookup[iVar15] + local_e0;
          vlinetallasm4();
          pBVar8 = dc_destorg;
          iVar12 = ylookup[iVar6];
          lVar14 = 0;
          do {
            iVar15 = local_a8[lVar14] - iVar6;
            if (iVar15 != 0 && iVar6 <= local_a8[lVar14]) {
              dc_iscale = vince[lVar14];
              dc_colormap = (lighttable_t *)CONCAT44(palookupoffse[0]._4_4_,palookupoffse[0]._0_4_);
              dc_texturefrac = vplce[lVar14];
              dc_source = bufplce[lVar14];
              dc_dest = pBVar8 + lVar14 + iVar12 + local_e0;
              dc_count = iVar15;
              (*doprevline1)();
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 != 4);
        }
        else {
          lVar14 = 0;
          do {
            if ((bVar11 & 1) == 0) {
              dc_count = local_a8[lVar14] - local_a8[lVar14 + 4];
              dc_iscale = vince[lVar14];
              dc_colormap = palookupoffse[lVar14];
              dc_texturefrac = vplce[lVar14];
              dc_source = bufplce[lVar14];
              dc_dest = dc_destorg + (x1 + (int)lVar14 + ylookup[local_a8[lVar14 + 4]]);
              (*doprevline1)();
            }
            bVar11 = (char)bVar11 >> 1;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 4);
        }
      }
      local_e0 = local_e0 + 4;
      psVar13 = psVar13 + 4;
      psVar16 = psVar16 + 4;
      local_f0 = local_f0 + 4;
      pfVar17 = pfVar17 + 4;
      x1 = x1 + 4;
    } while (local_e0 < local_70);
    x1 = (int)local_e0;
    iVar12 = (int)local_88;
  }
  iVar15 = iVar12 - x1;
  if (iVar15 != 0 && x1 <= iVar12) {
    dVar22 = 6755399441055744.0 / (double)(1 << (bVar9 & 0x1f));
    lVar14 = (long)x1;
    fVar20 = rw_lightstep;
    do {
      local_c8._0_4_ = (float)local_c8._0_4_ + fVar20;
      sVar2 = local_60[lVar14];
      sVar3 = local_58[lVar14];
      if (sVar2 < sVar3) {
        iVar12 = (int)sVar2;
        if (viewheight <= iVar12) {
          __assert_fail("y1ve[0] < viewheight",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_segs.cpp"
                        ,0x4c7,
                        "void wallscan(int, int, short *, short *, float *, fixed_t *, double, const BYTE *(*)(FTexture *, int))"
                       );
        }
        if (viewheight < sVar3) {
          __assert_fail("y2ve[0] <= viewheight",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_segs.cpp"
                        ,0x4c8,
                        "void wallscan(int, int, short *, short *, float *, fixed_t *, double, const BYTE *(*)(FTexture *, int))"
                       );
        }
        if (!bVar19 && !bVar18) {
          dVar23 = (double)(float)local_c8._0_4_;
          if (24.0 <= dVar23) {
            dVar23 = 24.0;
          }
          iVar6 = wallshade - SUB84(dVar23 + 103079215104.0,0) >> 0x10;
          if (0x1e < iVar6) {
            iVar6 = 0x1f;
          }
          if (iVar6 < 1) {
            iVar6 = 0;
          }
          dc_colormap = local_68 + (uint)(iVar6 << 8);
        }
        dc_source = (*local_48)(rw_pic,local_78[lVar14] + fVar4 >> 0x10);
        dc_dest = dc_destorg + lVar14 + ylookup[sVar2];
        dc_count = sVar3 - iVar12;
        dc_iscale = SUB84((double)local_80[lVar14] * local_40 + dVar22,0);
        dc_texturefrac =
             SUB84(dc_texturemid + dVar22 +
                   (((double)iVar12 + 0.5) - CenterY) * (double)local_80[lVar14] * local_40,0);
        (*dovline1)();
        fVar20 = rw_lightstep;
      }
      lVar14 = lVar14 + 1;
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
  }
  NetUpdate();
  return;
}

Assistant:

void wallscan (int x1, int x2, short *uwal, short *dwal, float *swal, fixed_t *lwal,
			   double yrepeat, const BYTE *(*getcol)(FTexture *tex, int x))
{
	int x, fracbits;
	int y1ve[4], y2ve[4], u4, d4, z;
	char bad;
	float light = rw_light - rw_lightstep;
	SDWORD xoffset;
	BYTE *basecolormapdata;
	double iscale;

	// This function also gets used to draw skies. Unlike BUILD, skies are
	// drawn by visplane instead of by bunch, so these checks are invalid.
	//if ((uwal[x1] > viewheight) && (uwal[x2] > viewheight)) return;
	//if ((dwal[x1] < 0) && (dwal[x2] < 0)) return;

	if (rw_pic->UseType == FTexture::TEX_Null)
	{
		return;
	}

//extern cycle_t WallScanCycles;
//clock (WallScanCycles);

	rw_pic->GetHeight();	// Make sure texture size is loaded
	fracbits = 32 - rw_pic->HeightBits;
	setupvline(fracbits);
	xoffset = rw_offset;
	basecolormapdata = basecolormap->Maps;

	x = x1;
	//while ((umost[x] > dmost[x]) && (x < x2)) x++;

	bool fixed = (fixedcolormap != NULL || fixedlightlev >= 0);
	if (fixed)
	{
		palookupoffse[0] = dc_colormap;
		palookupoffse[1] = dc_colormap;
		palookupoffse[2] = dc_colormap;
		palookupoffse[3] = dc_colormap;
	}

	for(; (x < x2) && (x & 3); ++x)
	{
		light += rw_lightstep;
		y1ve[0] = uwal[x];//max(uwal[x],umost[x]);
		y2ve[0] = dwal[x];//min(dwal[x],dmost[x]);
		if (y2ve[0] <= y1ve[0]) continue;
		assert (y1ve[0] < viewheight);
		assert (y2ve[0] <= viewheight);

		if (!fixed)
		{ // calculate lighting
			dc_colormap = basecolormapdata + (GETPALOOKUP (light, wallshade) << COLORMAPSHIFT);
		}

		dc_source = getcol (rw_pic, (lwal[x] + xoffset) >> FRACBITS);
		dc_dest = ylookup[y1ve[0]] + x + dc_destorg;
		dc_count = y2ve[0] - y1ve[0];
		iscale = swal[x] * yrepeat;
		dc_iscale = xs_ToFixed(fracbits, iscale);
		dc_texturefrac = xs_ToFixed(fracbits, dc_texturemid + iscale * (y1ve[0] - CenterY + 0.5));

		dovline1();
	}

	for(; x < x2-3; x += 4)
	{
		bad = 0;
		for (z = 3; z>= 0; --z)
		{
			y1ve[z] = uwal[x+z];//max(uwal[x+z],umost[x+z]);
			y2ve[z] = dwal[x+z];//min(dwal[x+z],dmost[x+z])-1;
			if (y2ve[z] <= y1ve[z]) { bad += 1<<z; continue; }
			assert (y1ve[z] < viewheight);
			assert (y2ve[z] <= viewheight);

			bufplce[z] = getcol (rw_pic, (lwal[x+z] + xoffset) >> FRACBITS);
			iscale = swal[x + z] * yrepeat;
			vince[z] = xs_ToFixed(fracbits, iscale);
			vplce[z] = xs_ToFixed(fracbits, dc_texturemid + iscale * (y1ve[z] - CenterY + 0.5));
		}
		if (bad == 15)
		{
			light += rw_lightstep * 4;
			continue;
		}

		if (!fixed)
		{
			for (z = 0; z < 4; ++z)
			{
				light += rw_lightstep;
				palookupoffse[z] = basecolormapdata + (GETPALOOKUP (light, wallshade) << COLORMAPSHIFT);
			}
		}

		u4 = MAX(MAX(y1ve[0],y1ve[1]),MAX(y1ve[2],y1ve[3]));
		d4 = MIN(MIN(y2ve[0],y2ve[1]),MIN(y2ve[2],y2ve[3]));

		if ((bad != 0) || (u4 >= d4))
		{
			for (z = 0; z < 4; ++z)
			{
				if (!(bad & 1))
				{
					prevline1(vince[z],palookupoffse[z],y2ve[z]-y1ve[z],vplce[z],bufplce[z],ylookup[y1ve[z]]+x+z+dc_destorg);
				}
				bad >>= 1;
			}
			continue;
		}

		for (z = 0; z < 4; ++z)
		{
			if (u4 > y1ve[z])
			{
				vplce[z] = prevline1(vince[z],palookupoffse[z],u4-y1ve[z],vplce[z],bufplce[z],ylookup[y1ve[z]]+x+z+dc_destorg);
			}
		}

		if (d4 > u4)
		{
			dc_count = d4-u4;
			dc_dest = ylookup[u4]+x+dc_destorg;
			dovline4();
		}

		BYTE *i = x+ylookup[d4]+dc_destorg;
		for (z = 0; z < 4; ++z)
		{
			if (y2ve[z] > d4)
			{
				prevline1(vince[z],palookupoffse[0],y2ve[z]-d4,vplce[z],bufplce[z],i+z);
			}
		}
	}
	for(;x<x2;x++)
	{
		light += rw_lightstep;
		y1ve[0] = uwal[x];//max(uwal[x],umost[x]);
		y2ve[0] = dwal[x];//min(dwal[x],dmost[x]);
		if (y2ve[0] <= y1ve[0]) continue;
		assert (y1ve[0] < viewheight);
		assert (y2ve[0] <= viewheight);

		if (!fixed)
		{ // calculate lighting
			dc_colormap = basecolormapdata + (GETPALOOKUP (light, wallshade) << COLORMAPSHIFT);
		}

		dc_source = getcol (rw_pic, (lwal[x] + xoffset) >> FRACBITS);
		dc_dest = ylookup[y1ve[0]] + x + dc_destorg;
		dc_count = y2ve[0] - y1ve[0];
		iscale = swal[x] * yrepeat;
		dc_iscale = xs_ToFixed(fracbits, iscale);
		dc_texturefrac = xs_ToFixed(fracbits, dc_texturemid + iscale * (y1ve[0] - CenterY + 0.5));

		dovline1();
	}

//unclock (WallScanCycles);

	NetUpdate ();
}